

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

BoolAndFTShort __thiscall FreeTypeFaceWrapper::GetCapHeightInternal(FreeTypeFaceWrapper *this)

{
  BoolAndFTShort BVar1;
  
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    BVar1 = (BoolAndFTShort)(*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[3])();
    if (((uint)BVar1 & 1) != 0) {
      return BVar1;
    }
  }
  BVar1 = GetYBearingForUnicodeChar(this,0x48);
  return BVar1;
}

Assistant:

BoolAndFTShort FreeTypeFaceWrapper::GetCapHeightInternal()
{
	if(mFormatParticularWrapper)
	{
		BoolAndFTShort fontDependentResult = mFormatParticularWrapper->GetCapHeight();
		if(fontDependentResult.first)
			return fontDependentResult;
		else
			return CapHeightFromHHeight();

	}
	else
		return CapHeightFromHHeight();
}